

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  sexp_conflict psVar2;
  
  iVar1 = strcmp(version,"0.11.0");
  psVar2 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      sexp_define_foreign_aux(ctx,env,"bit-and",2,0,"sexp_bit_and",sexp_bit_and,0);
      sexp_define_foreign_aux(ctx,env,"bit-ior",2,0,"sexp_bit_ior",sexp_bit_ior,0);
      sexp_define_foreign_aux(ctx,env,"bit-xor",2,0,"sexp_bit_xor",sexp_bit_xor,0);
      sexp_define_foreign_aux
                (ctx,env,"arithmetic-shift",2,0,"sexp_arithmetic_shift",sexp_arithmetic_shift,0);
      sexp_define_foreign_aux(ctx,env,"bit-count",1,0,"sexp_bit_count",sexp_bit_count,0);
      sexp_define_foreign_aux
                (ctx,env,"integer-length",1,0,"sexp_integer_length",sexp_integer_length,0);
      sexp_define_foreign_aux(ctx,env,"bit-set?",2,0,"sexp_bit_set_p",sexp_bit_set_p,0);
      psVar2 = (sexp_conflict)0x43e;
    }
  }
  return psVar2;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_define_foreign(ctx, env, "bit-and",    2, sexp_bit_and);
  sexp_define_foreign(ctx, env, "bit-ior",    2, sexp_bit_ior);
  sexp_define_foreign(ctx, env, "bit-xor",    2, sexp_bit_xor);
  sexp_define_foreign(ctx, env, "arithmetic-shift",  2, sexp_arithmetic_shift);
  sexp_define_foreign(ctx, env, "bit-count",  1, sexp_bit_count);
  sexp_define_foreign(ctx, env, "integer-length",  1, sexp_integer_length);
  sexp_define_foreign(ctx, env, "bit-set?", 2, sexp_bit_set_p);
  return SEXP_VOID;
}